

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
          (PromiseDisposer *this,Canceler *params,Promise<void> *params_1)

{
  void *pvVar1;
  Canceler *params_00;
  Promise<void> *params_1_00;
  PromiseArena *arena;
  AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *ptr;
  Promise<void> *params_local_1;
  Canceler *params_local;
  
  pvVar1 = operator_new(0x400);
  params_00 = fwd<kj::Canceler&>(params);
  params_1_00 = fwd<kj::Promise<void>>(params_1);
  ctor<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::Canceler&,kj::Promise<void>>
            ((AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *)
             ((long)pvVar1 + 0x210),params_00,params_1_00);
  *(void **)((long)pvVar1 + 0x218) = pvVar1;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>,_kj::_::PromiseDisposer>
  ::Own((Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>,_kj::_::PromiseDisposer>
         *)this,(AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *)
                ((long)pvVar1 + 0x210));
  return (Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }